

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::dumpModuleProcesses
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  pointer ppcVar1;
  int i;
  long lVar2;
  Instruction moduleProcessed;
  Instruction local_90;
  
  for (lVar2 = 0;
      ppcVar1 = (this->moduleProcesses).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->moduleProcesses).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1) >> 3);
      lVar2 = lVar2 + 1) {
    local_90._vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
    local_90.resultId = 0;
    local_90.typeId = 0;
    local_90.opCode = OpModuleProcessed;
    local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_90.block = (Block *)0x0;
    Instruction::addStringOperand(&local_90,ppcVar1[lVar2]);
    Instruction::dump(&local_90,out);
    Instruction::~Instruction(&local_90);
  }
  return;
}

Assistant:

void Builder::dumpModuleProcesses(std::vector<unsigned int>& out) const
{
    for (int i = 0; i < (int)moduleProcesses.size(); ++i) {
        Instruction moduleProcessed(OpModuleProcessed);
        moduleProcessed.addStringOperand(moduleProcesses[i]);
        moduleProcessed.dump(out);
    }
}